

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall
LiteScript::_Type_CHARACTER::GarbageCollector
          (_Type_CHARACTER *this,Variable *object,offset_in_Memory_to_subr caller)

{
  void *pvVar1;
  Object *pOVar2;
  long in_RCX;
  code *pcVar3;
  long *plVar4;
  
  pOVar2 = Variable::operator->(object);
  plVar4 = (long *)((long)(pOVar2->memory->arr)._M_elems + in_RCX);
  pcVar3 = (code *)caller;
  if ((caller & 1) != 0) {
    pcVar3 = *(code **)(*plVar4 + -1 + caller);
  }
  pOVar2 = Variable::operator->(object);
  (*pcVar3)(plVar4,pOVar2->ID);
  pOVar2 = Variable::operator->(object);
  pvVar1 = pOVar2->data;
  if (**(char **)((long)pvVar1 + 0x28) == '\0') {
    pOVar2 = Variable::operator->(object);
    plVar4 = (long *)((long)(pOVar2->memory->arr)._M_elems + in_RCX);
    if ((caller & 1) != 0) {
      caller = *(undefined8 *)(*plVar4 + -1 + caller);
    }
    pOVar2 = Variable::operator->((Variable *)((long)pvVar1 + 0x10));
    (*(code *)caller)(plVar4,pOVar2->ID);
    return;
  }
  return;
}

Assistant:

void LiteScript::_Type_CHARACTER::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    (object->memory.*caller)(object->ID);
    const Character& C = object->GetData<Character>();
    if (!C.obj_string.isNull)
        (object->memory.*caller)((*C.obj_string)->ID);
}